

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O1

UserInfo * __thiscall
kj::_::NullableValue<kj::Url::UserInfo>::emplace<kj::Url::UserInfo>
          (NullableValue<kj::Url::UserInfo> *this,UserInfo *params)

{
  long lVar1;
  undefined8 uVar2;
  undefined8 *puVar3;
  char *pcVar4;
  size_t sVar5;
  ArrayDisposer *pAVar6;
  
  if (this->isSet == true) {
    this->isSet = false;
    if (((this->field_1).value.password.ptr.isSet == true) &&
       (lVar1 = *(long *)((long)&this->field_1 + 0x20), lVar1 != 0)) {
      uVar2 = *(undefined8 *)((long)&this->field_1 + 0x28);
      *(undefined8 *)((long)&this->field_1 + 0x20) = 0;
      *(undefined8 *)((long)&this->field_1 + 0x28) = 0;
      puVar3 = *(undefined8 **)((long)&this->field_1 + 0x30);
      (**(code **)*puVar3)(puVar3,lVar1,1,uVar2,uVar2,0);
    }
    pcVar4 = (this->field_1).value.username.content.ptr;
    if (pcVar4 != (char *)0x0) {
      sVar5 = (this->field_1).value.username.content.size_;
      (this->field_1).value.username.content.ptr = (char *)0x0;
      (this->field_1).value.username.content.size_ = 0;
      pAVar6 = (this->field_1).value.username.content.disposer;
      (**pAVar6->_vptr_ArrayDisposer)(pAVar6,pcVar4,1,sVar5,sVar5,0);
    }
  }
  (this->field_1).value.username.content.ptr = (params->username).content.ptr;
  (this->field_1).value.username.content.size_ = (params->username).content.size_;
  (this->field_1).value.username.content.disposer = (params->username).content.disposer;
  (params->username).content.ptr = (char *)0x0;
  (params->username).content.size_ = 0;
  Maybe<kj::String>::Maybe(&(this->field_1).value.password,&params->password);
  this->isSet = true;
  return (UserInfo *)&this->field_1;
}

Assistant:

inline T& emplace(Params&&... params) {
    if (isSet) {
      isSet = false;
      dtor(value);
    }
    ctor(value, kj::fwd<Params>(params)...);
    isSet = true;
    return value;
  }